

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

int CompareValueId(ON_Value **a,ON_Value **b)

{
  ON_Value *pOVar1;
  bool bVar2;
  
  if (a == (ON_Value **)0x0) {
    bVar2 = b != (ON_Value **)0x0;
  }
  else {
    if (b == (ON_Value **)0x0) {
      return 1;
    }
    pOVar1 = *b;
    if (*a != (ON_Value *)0x0) {
      if (pOVar1 == (ON_Value *)0x0) {
        return 1;
      }
      return (*a)->m_value_id - pOVar1->m_value_id;
    }
    bVar2 = pOVar1 != (ON_Value *)0x0;
  }
  return -(uint)bVar2;
}

Assistant:

static int CompareValueId( ON_Value * const * a, ON_Value * const * b )
{
  // handle NULLs in case somebody messes up the m_value[] array.
  if ( !a )
  {
    return b ? -1 : 0;
  }
  if (!b)
    return 1;

  return CompareValueIdHelper(*a,*b);
}